

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O0

uint8 * __thiscall
sentencepiece::ModelProto_SentencePiece::_InternalSerialize
          (ModelProto_SentencePiece *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  uint32 uVar2;
  ModelProto_SentencePiece_Type value;
  int size;
  string *s;
  uint8 *puVar3;
  InternalMetadata *pIVar4;
  void *data;
  float value_00;
  uint32 cached_has_bits;
  EpsCopyOutputStream *stream_local;
  uint8 *target_local;
  ModelProto_SentencePiece *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  stream_local = (EpsCopyOutputStream *)target;
  if ((uVar1 & 1) != 0) {
    s = _internal_piece_abi_cxx11_(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,1,s,target);
  }
  if ((uVar1 & 2) != 0) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8 *)stream_local);
    value_00 = _internal_score(this);
    uVar2 = google::protobuf::internal::WireFormatLite::MakeTag(2,WIRETYPE_FIXED32);
    puVar3 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uVar2,puVar3);
    uVar2 = google::protobuf::internal::WireFormatLite::EncodeFloat(value_00);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::CodedOutputStream::WriteLittleEndian32ToArray(uVar2,puVar3)
    ;
  }
  if ((uVar1 & 4) != 0) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8 *)stream_local);
    value = _internal_type(this);
    uVar2 = google::protobuf::internal::WireFormatLite::MakeTag(3,WIRETYPE_VARINT);
    puVar3 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uVar2,puVar3);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::CodedOutputStream::WriteVarint32SignExtendedToArray
                             (value,puVar3);
  }
  stream_local = (EpsCopyOutputStream *)
                 google::protobuf::internal::ExtensionSet::_InternalSerialize
                           (&this->_extensions_,200,0x20000000,(uint8 *)stream_local,stream);
  if (((uint)(this->super_MessageLite)._internal_metadata_.ptr_ & 1) == 1) {
    pIVar4 = &(this->super_MessageLite)._internal_metadata_;
    if (((uint)pIVar4->ptr_ & 1) == 1) {
      google::protobuf::internal::InternalMetadata::
      PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                (pIVar4);
    }
    else {
      google::protobuf::internal::GetEmptyString_abi_cxx11_();
    }
    data = (void *)std::__cxx11::string::data();
    pIVar4 = &(this->super_MessageLite)._internal_metadata_;
    if (((uint)pIVar4->ptr_ & 1) == 1) {
      google::protobuf::internal::InternalMetadata::
      PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                (pIVar4);
    }
    else {
      google::protobuf::internal::GetEmptyString_abi_cxx11_();
    }
    size = std::__cxx11::string::size();
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRaw
                             (stream,data,size,(uint8 *)stream_local);
  }
  return (uint8 *)stream_local;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* ModelProto_SentencePiece::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:sentencepiece.ModelProto.SentencePiece)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string piece = 1;
  if (cached_has_bits & 0x00000001u) {
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_piece(), target);
  }

  // optional float score = 2;
  if (cached_has_bits & 0x00000002u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteFloatToArray(2, this->_internal_score(), target);
  }

  // optional .sentencepiece.ModelProto.SentencePiece.Type type = 3 [default = NORMAL];
  if (cached_has_bits & 0x00000004u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      3, this->_internal_type(), target);
  }

  // Extension range [200, 536870912)
  target = _extensions_._InternalSerialize(
      200, 536870912, target, stream);

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:sentencepiece.ModelProto.SentencePiece)
  return target;
}